

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O2

void __thiscall
SemanticAnalyserTest_UndeclaredVariableAccessInArgumentThrows_Test::
~SemanticAnalyserTest_UndeclaredVariableAccessInArgumentThrows_Test
          (SemanticAnalyserTest_UndeclaredVariableAccessInArgumentThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, UndeclaredVariableAccessInArgumentThrows)
{
  std::string source = R"SRC(
  fn test(x: f32, y: f32): void
  {
    print("x = " : x : " y = " : y);
  }
  
  fn main(): f32
  {
    let x: f32 = 12;
    test(x, y);
    ret 0;
  }
  )SRC";
  throwTest(source);
}